

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O2

string * __thiscall
dynamicgraph::SignalBase<int>::shortName_abi_cxx11_
          (string *__return_storage_ptr__,SignalBase<int> *this)

{
  allocator<char> local_229;
  char buffer [128];
  istringstream iss;
  int aiStack_180 [88];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)(this + 8),_S_in);
  while (*(int *)((long)aiStack_180 + *(long *)(_iss + -0x18)) == 0) {
    std::istream::getline((char *)&iss,(long)buffer,-0x80);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,buffer,&local_229);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return __return_storage_ptr__;
}

Assistant:

std::string shortName() const {
    std::istringstream iss(name);
    const int SIZE = 128;
    char buffer[SIZE];
    while (iss.good()) {
      iss.getline(buffer, SIZE, ':');
    }
    const std::string res(buffer);
    return res;
  }